

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O0

XMLNodeAdapter * FileParse::operator>>(XMLNodeAdapter *node,Child<BSDFData::AngleBasis> *child)

{
  bool bVar1;
  XMLNodeAdapter *node_00;
  __sv_type _Var2;
  size_t local_68;
  char *local_60;
  undefined1 local_58 [8];
  optional<XMLNodeAdapter> childNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nodeName;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Child<BSDFData::AngleBasis> *child_local;
  XMLNodeAdapter *node_local;
  
  __end0 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&child->nodeNames);
  nodeName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&child->nodeNames);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (&__end0,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&nodeName), ((bVar1 ^ 0xffU) & 1) != 0) {
    childNode.super__Optional_base<XMLNodeAdapter,_false,_false>._M_payload.
    super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
    super__Optional_payload_base<XMLNodeAdapter>._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)
                       childNode.super__Optional_base<XMLNodeAdapter,_false,_false>._M_payload.
                       super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
                       super__Optional_payload_base<XMLNodeAdapter>._24_8_);
    local_68 = _Var2._M_len;
    local_60 = _Var2._M_str;
    (*(node->super_INodeAdapter<XMLNodeAdapter>)._vptr_INodeAdapter[6])
              (local_58,node,local_68,local_60);
    bVar1 = std::optional<XMLNodeAdapter>::has_value((optional<XMLNodeAdapter> *)local_58);
    if (bVar1) {
      node_00 = std::optional<XMLNodeAdapter>::value((optional<XMLNodeAdapter> *)local_58);
      BSDFData::operator>>(node_00,child->data);
    }
    std::optional<XMLNodeAdapter>::~optional((optional<XMLNodeAdapter> *)local_58);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0);
  }
  return node;
}

Assistant:

inline const NodeAdapter & operator>>(const NodeAdapter & node, const Child<T> & child)
    {
        for(const auto & nodeName : child.nodeNames)
        {
            auto childNode{node.getFirstChildByName(nodeName)};
            if(childNode.has_value())
            {
                childNode.value() >> child.data;
            }
        }
        return node;
    }